

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::DragBehaviorT<unsigned_int,int,float>
               (ImGuiDataType data_type,uint *v,float v_speed,uint v_min,uint v_max,char *format,
               float power,ImGuiDragFlags flags)

{
  bool bVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  bool bVar7;
  ImGuiInputSource IVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar19;
  undefined1 in_ZMM2 [64];
  undefined4 in_XMM5_Da;
  undefined1 in_register_00001344 [12];
  undefined1 local_68 [16];
  undefined8 local_38;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  pIVar6 = GImGui;
  uVar10 = data_type & 0xfffffffe;
  if (v_max < v_min) {
    return false;
  }
  if (v_speed == 0.0 && (v_min <= v_max && v_max - v_min != 0)) {
    auVar15 = vcvtusi2ss_avx512f(in_ZMM2._0_16_,v_max - v_min);
    v_speed = auVar15._0_4_ * GImGui->DragSpeedDefaultRatio;
    in_XMM0_Db = 0;
    in_XMM0_Dc = 0;
    in_XMM0_Dd = 0;
  }
  IVar8 = GImGui->ActiveIdSource;
  uVar12 = flags & 1;
  local_68._4_4_ = in_XMM0_Db;
  local_68._0_4_ = v_speed;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._12_4_ = in_XMM0_Dd;
  if (IVar8 == ImGuiInputSource_Mouse) {
    bVar7 = IsMousePosValid((ImVec2 *)0x0);
    if ((!bVar7) || ((pIVar6->IO).MouseDragMaxDistanceSqr[0] <= 1.0)) {
      IVar8 = pIVar6->ActiveIdSource;
      goto LAB_00261b2c;
    }
    fVar13 = (pIVar6->IO).NavInputs[(ulong)uVar12 + 0x1d];
    bVar7 = (pIVar6->IO).KeyShift;
    bVar1 = (pIVar6->IO).KeyAlt;
    fVar13 = (float)((uint)(bVar1 & 1) * (int)(fVar13 * 0.01) +
                    (uint)!(bool)(bVar1 & 1) * (int)fVar13);
    fVar13 = (float)((uint)(bVar7 & 1) * (int)(fVar13 * 10.0) +
                    (uint)!(bool)(bVar7 & 1) * (int)fVar13);
  }
  else {
LAB_00261b2c:
    fVar13 = 0.0;
    if (IVar8 == ImGuiInputSource_Nav) {
      uVar9 = 0;
      if (uVar10 == 8) {
        uVar9 = ImParseFormatPrecision(format,3);
      }
      auVar17._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.1,10.0);
      auVar17._8_56_ = extraout_var_00;
      local_38 = vmovlps_avx(auVar17._0_16_);
      fVar13 = *(float *)((long)&local_38 + (ulong)uVar12 * 4);
      if ((int)uVar9 < 0) {
        auVar15 = SUB6416(ZEXT464(0x800000),0);
      }
      else if (uVar9 < 10) {
        auVar15 = ZEXT416(*(uint *)(GetMinimumStepAtDecimalPrecision(int)::min_steps +
                                   (ulong)uVar9 * 4));
      }
      else {
        auVar18._0_4_ = powf(10.0,(float)(int)-uVar9);
        auVar18._4_60_ = extraout_var;
        auVar15 = auVar18._0_16_;
      }
      uVar2 = vcmpss_avx512f(auVar15,local_68,2);
      bVar7 = (bool)((byte)uVar2 & 1);
      v_speed = (float)((uint)bVar7 * (int)v_speed + (uint)!bVar7 * auVar15._0_4_);
    }
  }
  fVar13 = fVar13 * v_speed;
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  auVar15 = vxorps_avx512vl(ZEXT416((uint)fVar13),auVar15);
  iVar11 = v_max - v_min;
  fVar14 = (float)((uint)(uVar12 == 0) * (int)fVar13 + (uint)(uVar12 != 0) * auVar15._0_4_);
  if (v_max < v_min || iVar11 == 0) {
    bVar7 = false;
LAB_00261c76:
    bVar1 = false;
  }
  else {
    if ((*v < v_max) || (bVar7 = true, fVar14 <= 0.0)) {
      bVar7 = fVar14 < 0.0 && *v <= v_min;
    }
    if ((v_max <= v_min || uVar10 != 8) || power == 1.0) goto LAB_00261c76;
    if ((fVar14 < 0.0) && (0.0 < pIVar6->DragCurrentAccum)) goto LAB_00261caa;
    if (fVar14 <= 0.0) goto LAB_00261c76;
    bVar1 = pIVar6->DragCurrentAccum < 0.0;
  }
  if (((pIVar6->ActiveIdIsJustActivated == false) && (!bVar7)) && (!bVar1)) {
    if ((fVar13 != 0.0) || (NAN(fVar13))) {
      pIVar6->DragCurrentAccum = fVar14 + pIVar6->DragCurrentAccum;
      pIVar6->DragCurrentAccumDirty = true;
    }
    else if ((pIVar6->DragCurrentAccumDirty & 1U) == 0) {
      return false;
    }
    if ((v_max <= v_min || uVar10 != 8) || power == 1.0) {
      uVar9 = RoundScalarWithFormatT<unsigned_int,int>
                        (format,data_type,*v + (int)pIVar6->DragCurrentAccum);
      pIVar6->DragCurrentAccumDirty = false;
      uVar12 = *v;
      pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (float)(int)(uVar9 - uVar12);
    }
    else {
      auVar3._4_12_ = in_register_00001344;
      auVar3._0_4_ = in_XMM5_Da;
      auVar15 = vcvtusi2ss_avx512f(auVar3,*v - v_min);
      auVar4._4_12_ = in_register_00001344;
      auVar4._0_4_ = in_XMM5_Da;
      auVar3 = vcvtusi2ss_avx512f(auVar4,iVar11);
      fVar19 = auVar3._0_4_;
      fVar13 = powf(auVar15._0_4_ / fVar19,1.0 / power);
      auVar15 = ZEXT416((uint)(fVar13 + pIVar6->DragCurrentAccum / fVar19));
      uVar2 = vcmpss_avx512f(auVar15,ZEXT816(0) << 0x40,1);
      auVar15 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar15);
      fVar16 = powf((float)((uint)!(bool)((byte)uVar2 & 1) * auVar15._0_4_),power);
      uVar9 = RoundScalarWithFormatT<unsigned_int,int>
                        (format,data_type,(int)fVar16 * iVar11 + v_min);
      pIVar6->DragCurrentAccumDirty = false;
      auVar5._4_12_ = in_register_00001344;
      auVar5._0_4_ = in_XMM5_Da;
      auVar15 = vcvtusi2ss_avx512f(auVar5,uVar9 - v_min);
      fVar16 = powf(auVar15._0_4_ / fVar19,1.0 / power);
      pIVar6->DragCurrentAccum = pIVar6->DragCurrentAccum - (fVar16 - fVar13);
      uVar12 = *v;
    }
    if ((v_min < v_max) && (uVar12 != uVar9)) {
      if ((uVar9 < v_min) || (((uVar10 != 8 && (uVar12 < uVar9)) && (fVar14 < 0.0)))) {
        uVar9 = v_min;
      }
      if ((v_max < uVar9) || (((uVar10 != 8 && (uVar9 < uVar12)) && (0.0 < fVar14)))) {
        uVar9 = v_max;
      }
    }
    if (uVar12 == uVar9) {
      return false;
    }
    *v = uVar9;
    return true;
  }
LAB_00261caa:
  pIVar6->DragCurrentAccum = 0.0;
  pIVar6->DragCurrentAccumDirty = false;
  return false;
}

Assistant:

bool ImGui::DragBehaviorT(ImGuiDataType data_type, TYPE* v, float v_speed, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiDragFlags flags)
{
    ImGuiContext& g = *GImGui;
    const ImGuiAxis axis = (flags & ImGuiDragFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_clamped = (v_min < v_max);
    const bool is_power = (power != 1.0f && is_decimal && is_clamped && (v_max - v_min < FLT_MAX));
    const bool is_locked = (v_min > v_max);
    if (is_locked)
        return false;

    // Default tweak speed
    if (v_speed == 0.0f && is_clamped && (v_max - v_min < FLT_MAX))
        v_speed = (float)((v_max - v_min) * g.DragSpeedDefaultRatio);

    // Inputs accumulates into g.DragCurrentAccum, which is flushed into the current value as soon as it makes a difference with our precision settings
    float adjust_delta = 0.0f;
    if (g.ActiveIdSource == ImGuiInputSource_Mouse && IsMousePosValid() && g.IO.MouseDragMaxDistanceSqr[0] > 1.0f*1.0f)
    {
        adjust_delta = g.IO.MouseDelta[axis];
        if (g.IO.KeyAlt)
            adjust_delta *= 1.0f / 100.0f;
        if (g.IO.KeyShift)
            adjust_delta *= 10.0f;
    }
    else if (g.ActiveIdSource == ImGuiInputSource_Nav)
    {
        int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
        adjust_delta = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 1.0f / 10.0f, 10.0f)[axis];
        v_speed = ImMax(v_speed, GetMinimumStepAtDecimalPrecision(decimal_precision));
    }
    adjust_delta *= v_speed;

    // For vertical drag we currently assume that Up=higher value (like we do with vertical sliders). This may become a parameter.
    if (axis == ImGuiAxis_Y)
        adjust_delta = -adjust_delta;

    // Clear current value on activation
    // Avoid altering values and clamping when we are _already_ past the limits and heading in the same direction, so e.g. if range is 0..255, current value is 300 and we are pushing to the right side, keep the 300.
    bool is_just_activated = g.ActiveIdIsJustActivated;
    bool is_already_past_limits_and_pushing_outward = is_clamped && ((*v >= v_max && adjust_delta > 0.0f) || (*v <= v_min && adjust_delta < 0.0f));
    bool is_drag_direction_change_with_power = is_power && ((adjust_delta < 0 && g.DragCurrentAccum > 0) || (adjust_delta > 0 && g.DragCurrentAccum < 0));
    if (is_just_activated || is_already_past_limits_and_pushing_outward || is_drag_direction_change_with_power)
    {
        g.DragCurrentAccum = 0.0f;
        g.DragCurrentAccumDirty = false;
    }
    else if (adjust_delta != 0.0f)
    {
        g.DragCurrentAccum += adjust_delta;
        g.DragCurrentAccumDirty = true;
    }

    if (!g.DragCurrentAccumDirty)
        return false;

    TYPE v_cur = *v;
    FLOATTYPE v_old_ref_for_accum_remainder = (FLOATTYPE)0.0f;

    if (is_power)
    {
        // Offset + round to user desired precision, with a curve on the v_min..v_max range to get more precision on one side of the range
        FLOATTYPE v_old_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        FLOATTYPE v_new_norm_curved = v_old_norm_curved + (g.DragCurrentAccum / (v_max - v_min));
        v_cur = v_min + (SIGNEDTYPE)ImPow(ImSaturate((float)v_new_norm_curved), power) * (v_max - v_min);
        v_old_ref_for_accum_remainder = v_old_norm_curved;
    }
    else
    {
        v_cur += (SIGNEDTYPE)g.DragCurrentAccum;
    }

    // Round to user desired precision based on format string
    v_cur = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_cur);

    // Preserve remainder after rounding has been applied. This also allow slow tweaking of values.
    g.DragCurrentAccumDirty = false;
    if (is_power)
    {
        FLOATTYPE v_cur_norm_curved = ImPow((FLOATTYPE)(v_cur - v_min) / (FLOATTYPE)(v_max - v_min), (FLOATTYPE)1.0f / power);
        g.DragCurrentAccum -= (float)(v_cur_norm_curved - v_old_ref_for_accum_remainder);
    }
    else
    {
        g.DragCurrentAccum -= (float)((SIGNEDTYPE)v_cur - (SIGNEDTYPE)*v);
    }

    // Lose zero sign for float/double
    if (v_cur == (TYPE)-0)
        v_cur = (TYPE)0;

    // Clamp values (+ handle overflow/wrap-around for integer types)
    if (*v != v_cur && is_clamped)
    {
        if (v_cur < v_min || (v_cur > *v && adjust_delta < 0.0f && !is_decimal))
            v_cur = v_min;
        if (v_cur > v_max || (v_cur < *v && adjust_delta > 0.0f && !is_decimal))
            v_cur = v_max;
    }

    // Apply result
    if (*v == v_cur)
        return false;
    *v = v_cur;
    return true;
}